

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

void __thiscall Handler::DeleteVirtualMachine(Handler *this,int *vmId)

{
  uint8_t uVar1;
  mapped_type *pmVar2;
  reference pvVar3;
  reference pvVar4;
  Handler *this_00;
  unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  *in_RDI;
  uint16_t memorySize;
  uint16_t cpuCore;
  VirtualMachine *vm;
  PurchasedServer *purchasedServer;
  DeployedVirtualMachine *deployedVM;
  uint32_t deployedVMIdx;
  key_type *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  ushort uVar5;
  ushort uVar6;
  
  pmVar2 = std::
           unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](in_RDI,(key_type *)in_stack_ffffffffffffffb8);
  pvVar3 = std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>::operator[]
                     ((vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_> *)
                      (in_RDI + 0x1d52),(ulong)*pmVar2);
  pvVar4 = std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>::operator[]
                     ((vector<PurchasedServer,_std::allocator<PurchasedServer>_> *)
                      &in_RDI[0x1d51]._M_h._M_rehash_policy,
                      (ulong)*(ushort *)
                              ((long)&in_RDI[5]._M_h._M_rehash_policy._M_max_load_factor +
                              (ulong)pvVar3->purchasedServerId * 2));
  this_00 = (Handler *)
            std::vector<VirtualMachine,_std::allocator<VirtualMachine>_>::operator[]
                      ((vector<VirtualMachine,_std::allocator<VirtualMachine>_> *)
                       &in_RDI[1]._M_h._M_before_begin,(ulong)pvVar3->vmIdx);
  uVar6 = (ushort)this_00->deployEnergyCostParameter;
  uVar5 = *(uint16_t *)((long)&this_00->deployEnergyCostParameter + 2);
  if ((this_00->N & 1) == 0) {
    if ((pvVar3->location & 1U) == 0) {
      pvVar4->remainCpuCoreB = pvVar4->remainCpuCoreB + uVar6;
      pvVar4->remainMemorySizeB = pvVar4->remainMemorySizeB + uVar5;
    }
    else {
      pvVar4->remainCpuCoreA = pvVar4->remainCpuCoreA + uVar6;
      pvVar4->remainMemorySizeA = pvVar4->remainMemorySizeA + uVar5;
    }
  }
  else {
    pvVar4->remainCpuCoreA = pvVar4->remainCpuCoreA + (short)((int)(uint)uVar6 >> 1);
    pvVar4->remainCpuCoreB = pvVar4->remainCpuCoreB + (short)((int)(uint)uVar6 >> 1);
    pvVar4->remainMemorySizeA = pvVar4->remainMemorySizeA + (short)((int)(uint)uVar5 >> 1);
    pvVar4->remainMemorySizeB = pvVar4->remainMemorySizeB + (short)((int)(uint)uVar5 >> 1);
  }
  *(int *)((long)&in_RDI[0x1d52]._M_h._M_element_count + 4) =
       *(int *)((long)&in_RDI[0x1d52]._M_h._M_element_count + 4) + -1;
  std::
  unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::erase(in_RDI,(key_type *)in_stack_ffffffffffffffb8);
  std::
  unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::erase(in_RDI,(key_type *)in_stack_ffffffffffffffb8);
  uVar1 = CalculateVacancyRate
                    (this_00,(PurchasedServer *)
                             CONCAT26(uVar6,CONCAT24(uVar5,in_stack_ffffffffffffffc8)));
  pvVar4->vacancyRate = uVar1;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::erase((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void Handler::DeleteVirtualMachine(const int &vmId) {
    uint32_t deployedVMIdx = idDeployedVMMap[vmId];
    DeployedVirtualMachine &deployedVM = deployedVMs[deployedVMIdx];
    PurchasedServer &purchasedServer = purchasedServers[purchasedServerIdxMap[deployedVM.purchasedServerId]];
    VirtualMachine &vm = virtualMachines[deployedVM.vmIdx];
    uint16_t cpuCore = vm.cpuCore;
    uint16_t memorySize = vm.memorySize;

    if (vm.nodeType) {
        purchasedServer.remainCpuCoreA += cpuCore >> 1u;
        purchasedServer.remainCpuCoreB += cpuCore >> 1u;
        purchasedServer.remainMemorySizeA += memorySize >> 1u;
        purchasedServer.remainMemorySizeB += memorySize >> 1u;
    } else {
        if (deployedVM.location) {
            purchasedServer.remainCpuCoreA += cpuCore;
            purchasedServer.remainMemorySizeA += memorySize;
        } else {
            purchasedServer.remainCpuCoreB += cpuCore;
            purchasedServer.remainMemorySizeB += memorySize;
        }
    }

    --deployedVMNum;
    idDeployedVMMap.erase(vmId);
    idVirtualMachineMap.erase(vmId);
    purchasedServer.vacancyRate = CalculateVacancyRate(purchasedServer);
    purchasedServer.deployedVM.erase(deployedVMIdx);
}